

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::
~BVHNBuilderTwoLevel(BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive> *this)

{
  long lVar1;
  void *pvVar2;
  
  *(undefined ***)this = &PTR__BVHNBuilderTwoLevel_0219d060;
  lVar1 = *(long *)(this + 0x78);
  pvVar2 = *(void **)(this + 0x80);
  if (pvVar2 != (void *)0x0) {
    if ((ulong)(lVar1 << 5) < 0x1c00000) {
      alignedFree(pvVar2);
    }
    else {
      os_free(pvVar2,lVar1 << 5,(bool)this[0x68]);
    }
  }
  if (lVar1 != 0) {
    (**(code **)**(undefined8 **)(this + 0x60))(*(undefined8 **)(this + 0x60),lVar1 * -0x20,1);
  }
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  lVar1 = *(long *)(this + 0x50);
  pvVar2 = *(void **)(this + 0x58);
  if (pvVar2 != (void *)0x0) {
    if ((ulong)(lVar1 << 6) < 0x1c00000) {
      alignedFree(pvVar2);
    }
    else {
      os_free(pvVar2,lVar1 << 6,(bool)this[0x40]);
    }
  }
  if (lVar1 != 0) {
    (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),lVar1 * -0x40,1);
  }
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  std::
  vector<std::unique_ptr<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase,_std::default_delete<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase,_std::default_delete<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase>_>_>_>
  ::~vector((vector<std::unique_ptr<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase,_std::default_delete<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase,_std::default_delete<embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderBase>_>_>_>
             *)(this + 0x10));
  return;
}

Assistant:

BVHNBuilderTwoLevel<N,Mesh,Primitive>::~BVHNBuilderTwoLevel () {
    }